

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O2

void secp256k1_ge_set_gej_zinv(secp256k1_ge *r,secp256k1_gej *a,secp256k1_fe *zi)

{
  secp256k1_fe zi3;
  secp256k1_fe zi2;
  secp256k1_fe sStack_78;
  secp256k1_fe local_50;
  
  secp256k1_fe_impl_sqr(&local_50,zi);
  secp256k1_fe_impl_mul(&sStack_78,&local_50,zi);
  secp256k1_fe_impl_mul(&r->x,&a->x,&local_50);
  secp256k1_fe_impl_mul(&r->y,&a->y,&sStack_78);
  r->infinity = a->infinity;
  return;
}

Assistant:

static void secp256k1_ge_set_gej_zinv(secp256k1_ge *r, const secp256k1_gej *a, const secp256k1_fe *zi) {
    secp256k1_fe zi2;
    secp256k1_fe zi3;
    SECP256K1_GEJ_VERIFY(a);
    SECP256K1_FE_VERIFY(zi);
    VERIFY_CHECK(!a->infinity);

    secp256k1_fe_sqr(&zi2, zi);
    secp256k1_fe_mul(&zi3, &zi2, zi);
    secp256k1_fe_mul(&r->x, &a->x, &zi2);
    secp256k1_fe_mul(&r->y, &a->y, &zi3);
    r->infinity = a->infinity;

    SECP256K1_GE_VERIFY(r);
}